

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sglrShaderProgram.cpp
# Opt level: O2

void __thiscall sglr::ShaderProgram::~ShaderProgram(ShaderProgram *this)

{
  (this->super_VertexShader)._vptr_VertexShader = (_func_int **)&PTR___cxa_pure_virtual_01e70f20;
  (this->super_GeometryShader)._vptr_GeometryShader = (_func_int **)&DAT_01e70f58;
  (this->super_FragmentShader)._vptr_FragmentShader = (_func_int **)&DAT_01e70f70;
  std::__cxx11::string::~string((string *)&this->m_geomSrc);
  std::__cxx11::string::~string((string *)&this->m_fragSrc);
  std::__cxx11::string::~string((string *)&this->m_vertSrc);
  std::vector<sglr::UniformSlot,_std::allocator<sglr::UniformSlot>_>::~vector(&this->m_uniforms);
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~vector(&this->m_attributeNames);
  rr::FragmentShader::~FragmentShader(&this->super_FragmentShader);
  rr::GeometryShader::~GeometryShader(&this->super_GeometryShader);
  rr::VertexShader::~VertexShader(&this->super_VertexShader);
  return;
}

Assistant:

ShaderProgram::~ShaderProgram (void)
{
}